

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_astSequenceNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  long lVar1;
  _Bool _Var2;
  sysbvm_tuple_t sVar3;
  ulong uVar4;
  ulong slotCount;
  ulong uVar5;
  sysbvm_tuple_t slotCount_00;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_tuple_t local_f8;
  ulong uStack_f0;
  sysbvm_tuple_t local_e8;
  sysbvm_tuple_t sStack_e0;
  sysbvm_tuple_t local_d8;
  ulong uStack_d0;
  sysbvm_tuple_t local_c8;
  sysbvm_tuple_t sStack_c0;
  ulong local_b8;
  undefined8 *puStack_b0;
  sysbvm_tuple_t *local_a8;
  sysbvm_tuple_t sStack_a0;
  sysbvm_tuple_t local_98;
  sysbvm_tuple_t sStack_90;
  sysbvm_tuple_t *local_88;
  sysbvm_tuple_t local_80;
  sysbvm_tuple_t local_78;
  sysbvm_stackFrameRecord_t local_70;
  undefined8 local_60;
  sysbvm_stackFrameRecord_t local_58;
  undefined8 local_48;
  undefined1 *local_40;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_98 = 0;
  sStack_90 = 0;
  local_a8 = (sysbvm_tuple_t *)0x0;
  sStack_a0 = 0;
  local_b8 = 0;
  puStack_b0 = (undefined8 *)0x0;
  local_c8 = 0;
  sStack_c0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_e8 = 0;
  sStack_e0 = 0;
  local_f8 = 0;
  uStack_f0 = 0;
  local_58.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_58.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_58._12_4_ = 0;
  local_48 = 0xe;
  local_40 = (undefined1 *)&local_f8;
  sysbvm_stackFrame_pushRecord(&local_58);
  local_70.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_70.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_60 = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord(&local_70);
  sVar3 = *arguments;
  uStack_f0 = *(ulong *)(sVar3 + 0x28);
  uStack_d0 = *(ulong *)(sVar3 + 0x30);
  if ((uStack_f0 & 0xf) == 0 && uStack_f0 != 0) {
    slotCount_00 = (sysbvm_tuple_t)(*(uint *)(uStack_f0 + 0xc) >> 3);
  }
  else {
    slotCount_00 = 0;
  }
  if ((uStack_d0 & 0xf) == 0 && uStack_d0 != 0) {
    slotCount = (ulong)(*(uint *)(uStack_d0 + 0xc) >> 3);
  }
  else {
    slotCount = 0;
  }
  if ((slotCount_00 == 0 && slotCount == 0) && (*(long *)(sVar3 + 0x20) != 0)) {
    sysbvm_stackFrame_popRecord(&local_70);
    sysbvm_stackFrame_popRecord(&local_58);
    local_f8 = *arguments;
  }
  else {
    local_f8 = sysbvm_context_shallowCopy(context,sVar3);
    sVar3 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1]);
    *(sysbvm_tuple_t *)(local_f8 + 0x18) = sVar3;
    local_e8 = sysbvm_array_create(context,slotCount_00);
    if (slotCount_00 != 0) {
      sVar3 = 0;
      do {
        if ((uStack_f0 & 0xf) == 0 && uStack_f0 != 0) {
          sStack_e0 = *(sysbvm_tuple_t *)(uStack_f0 + 0x10 + sVar3 * 8);
        }
        else {
          sStack_e0 = 0;
        }
        local_d8 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                             (context,sStack_e0,(context->roots).pragmaType,arguments[1]);
        if ((local_e8 & 0xf) == 0 && local_e8 != 0) {
          *(sysbvm_tuple_t *)(local_e8 + 0x10 + sVar3 * 8) = local_d8;
        }
        sVar3 = sVar3 + 1;
      } while (slotCount_00 != sVar3);
    }
    *(sysbvm_tuple_t *)(local_f8 + 0x28) = local_e8;
    local_c8 = sysbvm_array_create(context,slotCount);
    local_98 = (context->roots).voidType;
    if (slotCount != 0) {
      uVar5 = 1;
      do {
        if ((uStack_d0 & 0xf) == 0 && uStack_d0 != 0) {
          sStack_c0 = *(sysbvm_tuple_t *)(uStack_d0 + 8 + uVar5 * 8);
        }
        else {
          sStack_c0 = 0;
        }
        if (uVar5 < slotCount) {
          local_b8 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                               (context,sStack_c0,(context->roots).voidType,arguments[1]);
        }
        else {
          local_b8 = sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment
                               (context,sStack_c0,arguments[1]);
        }
        _Var2 = sysbvm_astNode_isLiteralNode(context,local_b8);
        if (_Var2) {
          puStack_b0 = (undefined8 *)sysbvm_astLiteralNode_getValue(local_b8);
          uVar4 = (ulong)puStack_b0 & 0xf;
          if (uVar4 == 0 && puStack_b0 != (undefined8 *)0x0) {
            local_a8 = (sysbvm_tuple_t *)*puStack_b0;
          }
          else if ((int)uVar4 == 0xf) {
            local_a8 = (sysbvm_tuple_t *)
                       sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)puStack_b0 >> 4)
            ;
          }
          else {
            local_a8 = (sysbvm_tuple_t *)sysbvm_tuple_getImmediateTypeWithTag(context,uVar4);
          }
          uVar4 = (ulong)local_a8 & 0xf;
          if (uVar4 == 0 && local_a8 != (sysbvm_tuple_t *)0x0) {
            sStack_a0 = *local_a8;
          }
          else if ((int)uVar4 == 0xf) {
            sStack_a0 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)local_a8 >> 4);
          }
          else {
            sStack_a0 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar4);
          }
          sStack_90 = sysbvm_type_getAnalyzeConcreteMetaValueWithEnvironmentFunction
                                (context,sStack_a0);
          if (sStack_90 != 0) {
            local_78 = arguments[1];
            local_88 = local_a8;
            local_80 = local_b8;
            local_b8 = sysbvm_function_apply(context,sStack_90,3,(sysbvm_tuple_t *)&local_88,1);
          }
        }
        if ((local_b8 & 0xf) == 0 && local_b8 != 0) {
          local_98 = *(sysbvm_tuple_t *)(local_b8 + 0x20);
        }
        else {
          local_98 = 0;
        }
        if ((local_c8 & 0xf) == 0 && local_c8 != 0) {
          *(ulong *)(local_c8 + 8 + uVar5 * 8) = local_b8;
        }
        lVar1 = uVar5 + 1;
        uVar5 = uVar5 + 1;
      } while (lVar1 - slotCount != 1);
    }
    *(sysbvm_tuple_t *)(local_f8 + 0x30) = local_c8;
    *(sysbvm_tuple_t *)(local_f8 + 0x20) = local_98;
    sysbvm_stackFrame_popRecord(&local_70);
    sysbvm_stackFrame_popRecord(&local_58);
    if ((slotCount_00 == 0) && ((int)slotCount == 1)) {
      if ((local_c8 & 0xf) == 0 && local_c8 != 0) {
        local_f8 = *(sysbvm_tuple_t *)(local_c8 + 0x10);
      }
      else {
        local_f8 = 0;
      }
    }
  }
  return local_f8;
}

Assistant:

static sysbvm_tuple_t sysbvm_astSequenceNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astSequenceNode_t **sequenceNode = (sysbvm_astSequenceNode_t**)node;

    struct {
        sysbvm_astSequenceNode_t *analyzedSequenceNode;

        sysbvm_tuple_t pragmas;
        sysbvm_tuple_t analyzedPragmas;
        sysbvm_tuple_t pragma;
        sysbvm_tuple_t analyzedPragma;

        sysbvm_tuple_t expressions;
        sysbvm_tuple_t analyzedExpressions;
        sysbvm_tuple_t expression;
        sysbvm_tuple_t analyzedExpression;

        sysbvm_tuple_t elementValue;
        sysbvm_tuple_t elementType;
        sysbvm_tuple_t elementMetaType;
        sysbvm_tuple_t resultType;
        sysbvm_tuple_t concretizeFunction;
    } gcFrame = {0};

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*sequenceNode)->super.sourcePosition);

    gcFrame.pragmas = (*sequenceNode)->pragmas;
    gcFrame.expressions = (*sequenceNode)->expressions;
    size_t pragmaCount = sysbvm_array_getSize(gcFrame.pragmas);
    size_t expressionCount = sysbvm_array_getSize(gcFrame.expressions);
    if(pragmaCount == 0 && expressionCount == 0 && (*sequenceNode)->super.analyzedType)
    {
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return *node;
    }

    gcFrame.analyzedSequenceNode = (sysbvm_astSequenceNode_t *)sysbvm_context_shallowCopy(context, *node);
    gcFrame.analyzedSequenceNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);

    gcFrame.analyzedPragmas = sysbvm_array_create(context, pragmaCount);
    for(size_t i = 0; i < pragmaCount; ++i)
    {
        gcFrame.pragma = sysbvm_array_at(gcFrame.pragmas, i);
        gcFrame.analyzedPragma = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.pragma, context->roots.pragmaType, *environment);
        sysbvm_array_atPut(gcFrame.analyzedPragmas, i, gcFrame.analyzedPragma);
    }

    gcFrame.analyzedSequenceNode->pragmas = gcFrame.analyzedPragmas;

    gcFrame.analyzedExpressions = sysbvm_array_create(context, expressionCount);
    gcFrame.resultType = context->roots.voidType;
    for(size_t i = 0; i < expressionCount; ++i)
    {
        gcFrame.expression = sysbvm_array_at(gcFrame.expressions, i);
        if(i + 1 < expressionCount)
            gcFrame.analyzedExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.expression, context->roots.voidType, *environment);
        else
            gcFrame.analyzedExpression = sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment(context, gcFrame.expression, *environment);

        // FIXME: Move this metavalue decay onto the type checker.
        if(sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedExpression))
        {
            gcFrame.elementValue = sysbvm_astLiteralNode_getValue(gcFrame.analyzedExpression);
            gcFrame.elementType = sysbvm_tuple_getType(context, gcFrame.elementValue);
            gcFrame.elementMetaType = sysbvm_tuple_getType(context, gcFrame.elementType);
            gcFrame.concretizeFunction = sysbvm_type_getAnalyzeConcreteMetaValueWithEnvironmentFunction(context, gcFrame.elementMetaType);
            if(gcFrame.concretizeFunction)
                gcFrame.analyzedExpression = sysbvm_function_applyNoCheck3(context, gcFrame.concretizeFunction, gcFrame.elementType, gcFrame.analyzedExpression, *environment);
        }

        gcFrame.resultType = sysbvm_astNode_getAnalyzedType(gcFrame.analyzedExpression);
        sysbvm_array_atPut(gcFrame.analyzedExpressions, i, gcFrame.analyzedExpression);
    }

    gcFrame.analyzedSequenceNode->expressions = gcFrame.analyzedExpressions;
    gcFrame.analyzedSequenceNode->super.analyzedType = gcFrame.resultType;
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);

    if(pragmaCount == 0 && expressionCount == 1)
        return sysbvm_array_at(gcFrame.analyzedExpressions, 0);

    return (sysbvm_tuple_t)gcFrame.analyzedSequenceNode;
}